

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O0

JSONNode __thiscall JSONNode::as_array(JSONNode *this)

{
  internalJSONNode *piVar1;
  uchar uVar2;
  JSONNode **ppJVar3;
  JSONNode *in_RSI;
  JSONNode **runner_end;
  JSONNode **runner;
  allocator local_39;
  json_string local_38;
  JSONNode *this_local;
  JSONNode *res;
  
  piVar1 = in_RSI->internal;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"no internal",&local_39);
  JSONDebug::_JSON_ASSERT(piVar1 != (internalJSONNode *)0x0,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  uVar2 = type(in_RSI);
  if (uVar2 == '\x04') {
    JSONNode(this,in_RSI);
  }
  else {
    uVar2 = type(in_RSI);
    if (uVar2 == '\x05') {
      duplicate(this);
      this->internal->_type = '\x04';
      runner_end = jsonChildren::begin(this->internal->Children);
      ppJVar3 = jsonChildren::end(this->internal->Children);
      for (; runner_end != ppJVar3; runner_end = runner_end + 1) {
        clear_name(*runner_end);
      }
    }
    else {
      JSONNode(this,'\x04');
    }
  }
  return (JSONNode)(internalJSONNode *)this;
}

Assistant:

JSONNode JSONNode::as_array(void) const json_nothrow {
	   JSON_CHECK_INTERNAL();
	   if (type() == JSON_ARRAY){
		  return *this;
	   } else if (type() == JSON_NODE){
		  JSONNode res(duplicate());
		  res.internal -> _type = JSON_ARRAY;
		  json_foreach(res.internal -> CHILDREN, runner){
			 (*runner) -> clear_name();
		  }
		  return res;
	   }
	   #ifdef JSON_MUTEX_CALLBACKS
		  if (internal -> mylock != 0){
			 JSONNode res(JSON_ARRAY);
			 res.set_mutex(internal -> mylock);
			 return res;
		  }
	   #endif
	   return JSONNode(JSON_ARRAY);
    }